

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O3

void CollectNodesAndComputePaths_rec
               (DdManager *dd,DdNode *aFunc,DdNode *bCube,st__table *Visited,st__table *CutNodes)

{
  int *piVar1;
  st__table *CutNodes_00;
  int iVar2;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *pDVar5;
  char **slot;
  char **local_40;
  st__table *local_38;
  
  iVar2 = st__find_or_add(Visited,(char *)aFunc,&local_40);
  if (iVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                  ,0x4c9,
                  "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
                 );
  }
  piVar1 = (int *)*local_40;
  local_38 = CutNodes;
  if (0 < *piVar1) {
    pDVar5 = *(DdNode **)(piVar1 + 2);
    pDVar3 = Cudd_bddOr(dd,pDVar5,bCube);
    *(DdNode **)(piVar1 + 2) = pDVar3;
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,pDVar5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      uVar4 = (ulong)aFunc->index;
      if ((uVar4 == 0x7fffffff) || (s_CutLevel <= dd->perm[uVar4])) {
        iVar2 = st__find_or_add(local_38,(char *)aFunc,&local_40);
        if (iVar2 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                        ,0x4bf,
                        "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
                       );
        }
        pDVar5 = *(DdNode **)(piVar1 + 2);
        *local_40 = (char *)pDVar5;
        Cudd_Ref(pDVar5);
      }
      else {
        pDVar5 = dd->vars[uVar4];
        pDVar3 = Cudd_bddAnd(dd,*(DdNode **)(piVar1 + 2),(DdNode *)((ulong)pDVar5 ^ 1));
        Cudd_Ref(pDVar3);
        pDVar5 = Cudd_bddAnd(dd,*(DdNode **)(piVar1 + 2),pDVar5);
        Cudd_Ref(pDVar5);
        CutNodes_00 = local_38;
        CollectNodesAndComputePaths_rec(dd,(aFunc->type).kids.E,pDVar3,Visited,local_38);
        CollectNodesAndComputePaths_rec(dd,(aFunc->type).kids.T,pDVar5,Visited,CutNodes_00);
        Cudd_RecursiveDeref(dd,pDVar3);
        Cudd_RecursiveDeref(dd,pDVar5);
      }
    }
    return;
  }
  __assert_fail("p->nEdges > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddCas.c"
                ,0x493,
                "void CollectNodesAndComputePaths_rec(DdManager *, DdNode *, DdNode *, st__table *, st__table *)"
               );
}

Assistant:

void CollectNodesAndComputePaths_rec( DdManager * dd, DdNode * aFunc, DdNode * bCube, st__table * Visited, st__table * CutNodes )
{   
    // find the node in the visited table
    DdNode * bTemp;
    traventry * p;
    char **slot;
    if ( st__find_or_add(Visited, (char*)aFunc, &slot) )
    { // the node is found
        // get the pointer to the traversal entry
        p = (traventry*) *slot;

        // make sure that the counter of incoming edges is positive
        assert( p->nEdges > 0 );

        // add the cube to the currently accumulated cubes
        p->bSum = Cudd_bddOr( dd, bTemp = p->bSum, bCube );  Cudd_Ref( p->bSum );
        Cudd_RecursiveDeref( dd, bTemp );

        // decrement the number of visits
        p->nEdges--;

        // if more visits to this node are expected, return
        if ( p->nEdges ) 
            return;
        else // if ( p->nEdges == 0 )
        { // this is the last visit - propagate the cube

            // check where this node is
            if ( cuddI(dd,aFunc->index) < s_CutLevel )
            { // the node is above the cut
                DdNode * bCube0, * bCube1;

                // get the top-most variable
                DdNode * bVarTop = dd->vars[aFunc->index];

                // compute the propagated cubes
                bCube0 = Cudd_bddAnd( dd, p->bSum, Cudd_Not( bVarTop ) );   Cudd_Ref( bCube0 );
                bCube1 = Cudd_bddAnd( dd, p->bSum,           bVarTop   );   Cudd_Ref( bCube1 );

                // call recursively
                CollectNodesAndComputePaths_rec( dd, cuddE(aFunc), bCube0, Visited, CutNodes );
                CollectNodesAndComputePaths_rec( dd, cuddT(aFunc), bCube1, Visited, CutNodes );

                // dereference the cubes
                Cudd_RecursiveDeref( dd, bCube0 );
                Cudd_RecursiveDeref( dd, bCube1 );
                return;
            }
            else
            { // the node is below the cut
                // add this node to the cut node table, if it is not yet there

//              DdNode * bNode;
//              bNode = Cudd_addBddPattern( dd, aFunc );  Cudd_Ref( bNode );
                if ( st__find_or_add(CutNodes, (char*)aFunc, &slot) )
                { // the node exists - should never happen
                    assert( 0 );
                }
                *slot = (char*) p->bSum;   Cudd_Ref( p->bSum );
                // the table takes the reference of bNode
                return;
            }
        }
    }

    // the node does not exist in the visited table - should never happen
    assert(0);

}